

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::TransitionResourceStates
          (DeviceContextVkImpl *this,Uint32 BarrierCount,StateTransitionDesc *pResourceBarriers)

{
  RESOURCE_STATE RVar1;
  RESOURCE_STATE RVar2;
  STATE_TRANSITION_FLAGS SVar3;
  bool bVar4;
  RenderPassVkImpl *pRVar5;
  Char *pCVar6;
  StateTransitionDesc *Barrier_00;
  TextureVkImpl *TextureVk;
  BufferVkImpl *BufferVk;
  BottomLevelASVkImpl *BLAS;
  TopLevelASVkImpl *TLAS;
  Uint32 local_118;
  Uint32 local_114;
  undefined1 local_f0 [8];
  string msg_3;
  RefCntAutoPtr<Diligent::TopLevelASVkImpl> pTopLevelAS;
  RefCntAutoPtr<Diligent::BottomLevelASVkImpl> pBottomLevelAS;
  RefCntAutoPtr<Diligent::BufferVkImpl> pBuffer;
  VkImageSubresourceRange SubResRange;
  RefCntAutoPtr<Diligent::TextureVkImpl> pTexture;
  string msg_2;
  string msg_1;
  StateTransitionDesc *Barrier;
  Uint32 i;
  undefined1 local_40 [8];
  string msg;
  StateTransitionDesc *pResourceBarriers_local;
  Uint32 BarrierCount_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = pResourceBarriers;
  pRVar5 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                       super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
  if (pRVar5 != (RenderPassVkImpl *)0x0) {
    FormatString<char[55]>
              ((string *)local_40,
               (char (*) [55])"State transitions are not allowed inside a render pass");
    pCVar6 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar6,"TransitionResourceStates",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd22);
    std::__cxx11::string::~string((string *)local_40);
  }
  if (BarrierCount != 0) {
    EnsureVkCmdBuffer(this);
    for (Barrier._0_4_ = 0; (uint)Barrier < BarrierCount; Barrier._0_4_ = (uint)Barrier + 1) {
      Barrier_00 = (StateTransitionDesc *)(msg.field_2._8_8_ + (ulong)(uint)Barrier * 0x30);
      DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyStateTransitionDesc
                ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Barrier_00);
      if (Barrier_00->TransitionType == STATE_TRANSITION_TYPE_BEGIN) {
        SVar3 = Diligent::operator&(Barrier_00->Flags,STATE_TRANSITION_FLAG_UPDATE_STATE);
        if (SVar3 != STATE_TRANSITION_FLAG_NONE) {
          FormatString<char[55]>
                    ((string *)((long)&msg_2.field_2 + 8),
                     (char (*) [55])"Resource state can\'t be updated in begin-split barrier");
          pCVar6 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar6,"TransitionResourceStates",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xd32);
          std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
        }
      }
      else {
        SVar3 = Diligent::operator&(Barrier_00->Flags,STATE_TRANSITION_FLAG_ALIASING);
        if (SVar3 == STATE_TRANSITION_FLAG_NONE) {
          if ((Barrier_00->TransitionType != STATE_TRANSITION_TYPE_IMMEDIATE) &&
             (Barrier_00->TransitionType != STATE_TRANSITION_TYPE_END)) {
            FormatString<char[24]>((string *)&pTexture,(char (*) [24])"Unexpected barrier type");
            pCVar6 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar6,"TransitionResourceStates",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0xd3b);
            std::__cxx11::string::~string((string *)&pTexture);
          }
          RefCntAutoPtr<Diligent::TextureVkImpl>::RefCntAutoPtr
                    ((RefCntAutoPtr<Diligent::TextureVkImpl> *)&SubResRange.baseArrayLayer,
                     &Barrier_00->pResource->super_IObject,(INTERFACE_ID *)IID_TextureVk);
          bVar4 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                            ((RefCntAutoPtr *)&SubResRange.baseArrayLayer);
          if (bVar4) {
            pBuffer.m_pObject._4_4_ = 0;
            if (Barrier_00->MipLevelsCount == 0xffffffff) {
              local_114 = 0xffffffff;
            }
            else {
              local_114 = Barrier_00->MipLevelsCount;
            }
            SubResRange.aspectMask = local_114;
            SubResRange.baseMipLevel = Barrier_00->FirstArraySlice;
            if (Barrier_00->ArraySliceCount == 0xffffffff) {
              local_118 = 0xffffffff;
            }
            else {
              local_118 = Barrier_00->ArraySliceCount;
            }
            SubResRange.levelCount = local_118;
            TextureVk = RefCntAutoPtr<Diligent::TextureVkImpl>::operator*
                                  ((RefCntAutoPtr<Diligent::TextureVkImpl> *)
                                   &SubResRange.baseArrayLayer);
            TransitionTextureState
                      (this,TextureVk,Barrier_00->OldState,Barrier_00->NewState,Barrier_00->Flags,
                       (VkImageSubresourceRange *)((long)&pBuffer.m_pObject + 4));
          }
          else {
            RefCntAutoPtr<Diligent::BufferVkImpl>::RefCntAutoPtr
                      ((RefCntAutoPtr<Diligent::BufferVkImpl> *)&pBottomLevelAS,
                       &Barrier_00->pResource->super_IObject,(INTERFACE_ID *)IID_BufferVk);
            bVar4 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&pBottomLevelAS)
            ;
            if (bVar4) {
              BufferVk = RefCntAutoPtr<Diligent::BufferVkImpl>::operator*
                                   ((RefCntAutoPtr<Diligent::BufferVkImpl> *)&pBottomLevelAS);
              RVar1 = Barrier_00->OldState;
              RVar2 = Barrier_00->NewState;
              SVar3 = Diligent::operator&(Barrier_00->Flags,STATE_TRANSITION_FLAG_UPDATE_STATE);
              TransitionBufferState(this,BufferVk,RVar1,RVar2,SVar3 != STATE_TRANSITION_FLAG_NONE);
            }
            else {
              RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::RefCntAutoPtr
                        ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&pTopLevelAS,
                         &Barrier_00->pResource->super_IObject,(INTERFACE_ID *)IID_BottomLevelAS);
              bVar4 = Diligent::RefCntAutoPtr::operator_cast_to_bool((RefCntAutoPtr *)&pTopLevelAS);
              if (bVar4) {
                BLAS = RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::operator*
                                 ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&pTopLevelAS);
                RVar1 = Barrier_00->OldState;
                RVar2 = Barrier_00->NewState;
                SVar3 = Diligent::operator&(Barrier_00->Flags,STATE_TRANSITION_FLAG_UPDATE_STATE);
                TransitionBLASState(this,BLAS,RVar1,RVar2,SVar3 != STATE_TRANSITION_FLAG_NONE);
              }
              else {
                RefCntAutoPtr<Diligent::TopLevelASVkImpl>::RefCntAutoPtr
                          ((RefCntAutoPtr<Diligent::TopLevelASVkImpl> *)((long)&msg_3.field_2 + 8),
                           &Barrier_00->pResource->super_IObject,(INTERFACE_ID *)IID_TopLevelAS);
                bVar4 = Diligent::RefCntAutoPtr::operator_cast_to_bool
                                  ((RefCntAutoPtr *)(msg_3.field_2._M_local_buf + 8));
                if (bVar4) {
                  TLAS = RefCntAutoPtr<Diligent::TopLevelASVkImpl>::operator*
                                   ((RefCntAutoPtr<Diligent::TopLevelASVkImpl> *)
                                    ((long)&msg_3.field_2 + 8));
                  RVar1 = Barrier_00->OldState;
                  RVar2 = Barrier_00->NewState;
                  SVar3 = Diligent::operator&(Barrier_00->Flags,STATE_TRANSITION_FLAG_UPDATE_STATE);
                  TransitionTLASState(this,TLAS,RVar1,RVar2,SVar3 != STATE_TRANSITION_FLAG_NONE);
                }
                else {
                  FormatString<char[26]>
                            ((string *)local_f0,(char (*) [26])"unsupported resource type");
                  pCVar6 = (Char *)std::__cxx11::string::c_str();
                  DebugAssertionFailed
                            (pCVar6,"TransitionResourceStates",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                             ,0xd55);
                  std::__cxx11::string::~string((string *)local_f0);
                }
                RefCntAutoPtr<Diligent::TopLevelASVkImpl>::~RefCntAutoPtr
                          ((RefCntAutoPtr<Diligent::TopLevelASVkImpl> *)((long)&msg_3.field_2 + 8));
              }
              RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::~RefCntAutoPtr
                        ((RefCntAutoPtr<Diligent::BottomLevelASVkImpl> *)&pTopLevelAS);
            }
            RefCntAutoPtr<Diligent::BufferVkImpl>::~RefCntAutoPtr
                      ((RefCntAutoPtr<Diligent::BufferVkImpl> *)&pBottomLevelAS);
          }
          RefCntAutoPtr<Diligent::TextureVkImpl>::~RefCntAutoPtr
                    ((RefCntAutoPtr<Diligent::TextureVkImpl> *)&SubResRange.baseArrayLayer);
        }
        else {
          AliasingBarrier(this,Barrier_00->pResourceBefore,Barrier_00->pResource);
        }
      }
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionResourceStates(Uint32 BarrierCount, const StateTransitionDesc* pResourceBarriers)
{
    VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");

    if (BarrierCount == 0)
        return;

    EnsureVkCmdBuffer();

    for (Uint32 i = 0; i < BarrierCount; ++i)
    {
        const StateTransitionDesc& Barrier = pResourceBarriers[i];
#ifdef DILIGENT_DEVELOPMENT
        DvpVerifyStateTransitionDesc(Barrier);
#endif
        if (Barrier.TransitionType == STATE_TRANSITION_TYPE_BEGIN)
        {
            // Skip begin-split barriers
            VERIFY((Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) == 0, "Resource state can't be updated in begin-split barrier");
            continue;
        }
        if (Barrier.Flags & STATE_TRANSITION_FLAG_ALIASING)
        {
            AliasingBarrier(Barrier.pResourceBefore, Barrier.pResource);
        }
        else
        {
            VERIFY(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE || Barrier.TransitionType == STATE_TRANSITION_TYPE_END, "Unexpected barrier type");

            if (RefCntAutoPtr<TextureVkImpl> pTexture{Barrier.pResource, IID_TextureVk})
            {
                VkImageSubresourceRange SubResRange;
                SubResRange.aspectMask     = 0;
                SubResRange.baseMipLevel   = Barrier.FirstMipLevel;
                SubResRange.levelCount     = (Barrier.MipLevelsCount == REMAINING_MIP_LEVELS) ? VK_REMAINING_MIP_LEVELS : Barrier.MipLevelsCount;
                SubResRange.baseArrayLayer = Barrier.FirstArraySlice;
                SubResRange.layerCount     = (Barrier.ArraySliceCount == REMAINING_ARRAY_SLICES) ? VK_REMAINING_ARRAY_LAYERS : Barrier.ArraySliceCount;
                TransitionTextureState(*pTexture, Barrier.OldState, Barrier.NewState, Barrier.Flags, &SubResRange);
            }
            else if (RefCntAutoPtr<BufferVkImpl> pBuffer{Barrier.pResource, IID_BufferVk})
            {
                TransitionBufferState(*pBuffer, Barrier.OldState, Barrier.NewState, (Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0);
            }
            else if (RefCntAutoPtr<BottomLevelASVkImpl> pBottomLevelAS{Barrier.pResource, IID_BottomLevelAS})
            {
                TransitionBLASState(*pBottomLevelAS, Barrier.OldState, Barrier.NewState, (Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0);
            }
            else if (RefCntAutoPtr<TopLevelASVkImpl> pTopLevelAS{Barrier.pResource, IID_TopLevelAS})
            {
                TransitionTLASState(*pTopLevelAS, Barrier.OldState, Barrier.NewState, (Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0);
            }
            else
            {
                UNEXPECTED("unsupported resource type");
            }
        }
    }
}